

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

bool __thiscall MeCab::Writer::writeUser(Writer *this,Lattice *lattice,StringBuffer *os)

{
  char *p;
  scoped_string *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Node *node;
  Writer *pWVar4;
  undefined4 extraout_var_00;
  
  p = (this->bos_format_).super_scoped_array<char>.ptr_;
  pWVar4 = (Writer *)lattice;
  iVar3 = (*lattice->_vptr_Lattice[2])();
  bVar2 = writeNode(pWVar4,lattice,p,(Node *)CONCAT44(extraout_var,iVar3),os);
  if (bVar2) {
    pWVar4 = (Writer *)lattice;
    iVar3 = (*lattice->_vptr_Lattice[2])();
    node = (Node *)CONCAT44(extraout_var_00,iVar3);
    do {
      node = node->next;
      if (node->next == (mecab_node_t *)0x0) {
        bVar2 = writeNode(pWVar4,lattice,(this->eos_format_).super_scoped_array<char>.ptr_,node,os);
        return bVar2;
      }
      psVar1 = &this->node_format_;
      if (node->stat == '\x01') {
        psVar1 = &this->unk_format_;
      }
      bVar2 = writeNode(pWVar4,lattice,(psVar1->super_scoped_array<char>).ptr_,node,os);
    } while (bVar2);
  }
  return false;
}

Assistant:

bool Writer::writeUser(Lattice *lattice, StringBuffer *os) const {
  if (!writeNode(lattice, bos_format_.get(), lattice->bos_node(), os)) {
    return false;
  }
  const Node *node = 0;
  for (node = lattice->bos_node()->next; node->next; node = node->next) {
    const char *fmt = (node->stat == MECAB_UNK_NODE ? unk_format_.get() :
                       node_format_.get());
    if (!writeNode(lattice, fmt, node, os)) {
      return false;
    }
  }
  if (!writeNode(lattice, eos_format_.get(), node, os)) {
    return false;
  }
  return true;
}